

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_stream_socket.c
# Opt level: O0

void oonf_stream_remove(oonf_stream_socket *stream_socket,_Bool force)

{
  list_entity *plVar1;
  list_entity *plVar2;
  os_fd *poVar3;
  bool bVar4;
  _Bool force_local;
  oonf_stream_socket *stream_socket_local;
  int result;
  
  if (((stream_socket->busy & 1U) == 0) || (force)) {
    bVar4 = false;
    if ((stream_socket->_node).next != (list_entity *)0x0) {
      bVar4 = (stream_socket->_node).prev != (list_entity *)0x0;
    }
    if (bVar4) {
      oonf_stream_close_all_sessions(stream_socket);
      plVar1 = (stream_socket->_node).prev;
      plVar2 = (stream_socket->_node).next;
      plVar1->next = plVar2;
      plVar2->prev = plVar1;
      (stream_socket->_node).prev = (list_entity *)0x0;
      (stream_socket->_node).next = (list_entity *)0x0;
      oonf_socket_remove(&stream_socket->scheduler_entry);
      poVar3 = &(stream_socket->scheduler_entry).fd;
      if (poVar3->fd != -1) {
        close(poVar3->fd);
        poVar3->fd = -1;
      }
      if ((stream_socket->config).cleanup_socket != (_func_void_oonf_stream_socket_ptr *)0x0) {
        (*(stream_socket->config).cleanup_socket)(stream_socket);
      }
    }
  }
  else {
    stream_socket->remove = true;
  }
  return;
}

Assistant:

void
oonf_stream_remove(struct oonf_stream_socket *stream_socket, bool force) {
  if (stream_socket->busy && !force) {
    stream_socket->remove = true;
    return;
  }

  if (!list_is_node_added(&stream_socket->_node)) {
    return;
  }

  oonf_stream_close_all_sessions(stream_socket);
  list_remove(&stream_socket->_node);

  oonf_socket_remove(&stream_socket->scheduler_entry);
  os_fd_close(&stream_socket->scheduler_entry.fd);

  if (stream_socket->config.cleanup_socket) {
    stream_socket->config.cleanup_socket(stream_socket);
  }
}